

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

bool __thiscall
cfd::AddressFactory::CheckAddressNetType(AddressFactory *this,Address *address,NetType net_type)

{
  bool bVar1;
  byte bVar2;
  NetType NVar3;
  uint uVar4;
  NetType in_EDX;
  Address *in_RSI;
  long in_RDI;
  AddressFormatData *prefix;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range1;
  AddressFormatData addr_format;
  AddressType addr_type;
  bool result;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_a8 [48];
  reference local_78;
  AddressFormatData *local_70;
  __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
  local_68;
  long local_60;
  AddressType local_24;
  byte local_1d;
  NetType local_1c;
  Address *local_18;
  byte local_1;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  NVar3 = core::Address::GetNetType(in_RSI);
  if (NVar3 == local_1c) {
    local_1 = 1;
  }
  else {
    local_1d = 0;
    local_24 = core::Address::GetAddressType(local_18);
    core::Address::GetAddressFormatData
              ((Address *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
    local_60 = in_RDI + 0x10;
    local_68._M_current =
         (AddressFormatData *)
         std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
         begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)CONCAT17(in_stack_ffffffffffffff1f,
                           CONCAT16(in_stack_ffffffffffffff1e,
                                    CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))))
    ;
    local_70 = (AddressFormatData *)
               std::
               vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
               end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *)CONCAT17(in_stack_ffffffffffffff1f,
                               CONCAT16(in_stack_ffffffffffffff1e,
                                        CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                                                ))));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff27,
                                          CONCAT16(in_stack_ffffffffffffff26,
                                                   CONCAT24(in_stack_ffffffffffffff24,
                                                            in_stack_ffffffffffffff20))),
                              (__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff1f,
                                          CONCAT16(in_stack_ffffffffffffff1e,
                                                   CONCAT24(in_stack_ffffffffffffff1c,
                                                            in_stack_ffffffffffffff18)))), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                 ::operator*(&local_68);
      NVar3 = cfd::core::AddressFormatData::GetNetType();
      if (NVar3 == local_1c) {
        if (local_24 == kP2shAddress) {
LAB_003d031a:
          bVar2 = cfd::core::AddressFormatData::GetP2shPrefix();
          uVar4 = (uint)bVar2;
          bVar2 = cfd::core::AddressFormatData::GetP2shPrefix();
          local_1d = uVar4 == bVar2;
          break;
        }
        if (local_24 == kP2pkhAddress) {
          bVar2 = cfd::core::AddressFormatData::GetP2pkhPrefix();
          uVar4 = (uint)bVar2;
          bVar2 = cfd::core::AddressFormatData::GetP2pkhPrefix();
          local_1d = uVar4 == bVar2;
          break;
        }
        if (1 < local_24 - kP2wshAddress) {
          if (local_24 - kP2shP2wshAddress < 2) goto LAB_003d031a;
          if (1 < local_24 - kTaprootAddress) {
            local_1d = 0;
            break;
          }
        }
        cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_();
        cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_();
        local_1d = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
        std::__cxx11::string::~string(local_a8);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
      ::operator++(&local_68);
    }
    local_1 = local_1d & 1;
    core::AddressFormatData::~AddressFormatData((AddressFormatData *)0x3d0409);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AddressFactory::CheckAddressNetType(
    const Address& address, NetType net_type) const {
  if (address.GetNetType() == net_type) {
    return true;
  }

  // check prefix
  bool result = false;
  AddressType addr_type = address.GetAddressType();
  AddressFormatData addr_format = address.GetAddressFormatData();
  for (auto& prefix : prefix_list_) {
    if (prefix.GetNetType() == net_type) {
      switch (addr_type) {
        case AddressType::kP2pkhAddress:
          result = (prefix.GetP2pkhPrefix() == addr_format.GetP2pkhPrefix());
          break;
        case AddressType::kP2shP2wpkhAddress:
          // fall-through
        case AddressType::kP2shP2wshAddress:
          // fall-through
        case AddressType::kP2shAddress:
          result = (prefix.GetP2shPrefix() == addr_format.GetP2shPrefix());
          break;
        case AddressType::kP2wpkhAddress:
          // fall-through
        case AddressType::kP2wshAddress:
          // fall-through
        case AddressType::kTaprootAddress:
          // fall-through
        case AddressType::kWitnessUnknown:
          result = (prefix.GetBech32Hrp() == addr_format.GetBech32Hrp());
          break;
        default:
          result = false;
          break;
      }
      break;
    }
  }

  return result;
}